

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * getDirectory_abi_cxx11_(void)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  string *in_RDI;
  char abs_path [1024];
  char acStack_418 [1032];
  
  uVar2 = readlink("/proc/self/exe",acStack_418,0x400);
  if (0x3ff < (uint)uVar2) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__throw_logic_error("basic_string::_M_construct null not valid");
  }
  uVar3 = uVar2 & 0xffffffff;
  do {
    if (acStack_418[uVar3] == '/') {
      acStack_418[uVar3] = '\0';
      break;
    }
    iVar1 = (int)uVar3;
    uVar3 = (ulong)(iVar1 - 1);
  } while (0 < iVar1);
  do {
    if (acStack_418[uVar2 & 0xffffffff] == '/') {
      acStack_418[uVar2 & 0xffffffff] = '\0';
      break;
    }
    iVar1 = (int)uVar2;
    uVar2 = (ulong)(iVar1 - 1);
  } while (0 < iVar1);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen(acStack_418);
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

string getDirectory() {
  char abs_path[1024];
  //获取可执行程序的绝对路径
  int cnt = readlink("/proc/self/exe", abs_path, 1024);
  if (cnt < 0 || cnt >= 1024) {
    return NULL;
  }

  //最后一个'/' 后面是可执行程序名，去掉devel/lib/m100/exe，只保留前面部分路径
  for (int i = cnt; i >= 0; --i) {
    if (abs_path[i] == '/') {
      abs_path[i] = '\0';
      break;
    }
  }
  for (int i = cnt; i >= 0; --i) {
    if (abs_path[i] == '/') {
      abs_path[i] = '\0';
      break;
    }
  }
  return string(abs_path);
}